

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

uint64_t LD_GenHashSeed(int index)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  uint64_t y;
  long local_10;
  
  if (LD_seed == 0) {
    iVar1 = rand();
    LD_seed = (uint64_t)iVar1;
  }
  local_10 = (long)index + LD_seed;
  uVar2 = 0x172a550d;
  lVar3 = 0;
  do {
    uVar2 = (ulong)*(byte *)((long)&local_10 + lVar3) + uVar2 * 0x172a554f;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  return uVar2 ^ 0x46253dc2;
}

Assistant:

uint64_t LD_GenHashSeed(int index) {
	/*
	if (index == 0) {
		srand(0);
	}
	*/
	if (LD_seed == 0) {
		LD_seed = rand();
	}
	uint64_t x, y = LD_seed + index;
	LD_mangle((const unsigned char*)&y, (unsigned char*)&x, 8);
	return LD_AwareHash((uint8_t*)&y, 8, 388650253, 388650319, 1176845762);
}